

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TessellationTests::init(TessellationTests *this,EVP_PKEY_CTX *ctx)

{
  IOType IVar1;
  Context *pCVar2;
  TestContext *pTVar3;
  undefined4 uVar4;
  TessPrimitiveType TVar5;
  VertexIOArraySize VVar6;
  CaseType caseType_00;
  int inputPatchSize;
  bool bVar7;
  int extraout_EAX;
  TestNode *pTVar8;
  LimitQueryCase *pLVar9;
  CombinedUniformLimitCase *pCVar10;
  TestNode *pTVar11;
  ReferencedByTessellationQueryCase *pRVar12;
  TestCaseGroup *pTVar13;
  TessCoordCase *this_00;
  char *pcVar14;
  WindingCase *this_01;
  PatchVertexCountCase *this_02;
  char *pcVar15;
  PerPatchDataCase *this_03;
  GLPositionCase *this_04;
  BarrierCase *this_05;
  char *pcVar16;
  CommonEdgeCase *this_06;
  FractionalSpacingModeCase *pFVar17;
  PrimitiveDiscardCase *this_07;
  TestCaseGroup *pTVar18;
  TestCaseGroup *this_08;
  TestCaseGroup *this_09;
  TestCaseGroup *this_10;
  TestCaseGroup *this_11;
  TestCaseGroup *this_12;
  TestCaseGroup *this_13;
  TestCaseGroup *this_14;
  TestCaseGroup *this_15;
  InvariantOuterEdgeCase *this_16;
  SymmetricOuterEdgeCase *this_17;
  OuterEdgeVertexSetIndexIndependenceCase *this_18;
  UserDefinedIOCase *pUVar19;
  RenderContext *pRVar20;
  ContextInfo *pCVar21;
  size_type sVar22;
  const_reference ppTVar23;
  char *local_1178;
  char *local_1170;
  bool local_1059;
  char *local_f80;
  char *local_e78;
  int local_b34;
  undefined1 local_b30 [4];
  int i_1;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children_1;
  ShaderLibrary shaderLibrary_1;
  undefined1 local_af8 [8];
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_> es32Group;
  undefined1 local_ae0 [4];
  int i;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderLibrary shaderLibrary;
  undefined1 local_aa8 [8];
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_> es31Group;
  undefined1 local_a90 [8];
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
  negativeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  allocator<char> local_9f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  TessPrimitiveType local_9ac;
  TessPrimitiveType local_9a8;
  TessPrimitiveType primitiveType_8;
  int primitiveTypeI_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  TessPrimitiveType local_920;
  TessPrimitiveType local_91c;
  TessPrimitiveType primitiveType_7;
  int primitiveTypeI_7;
  TestCaseGroup *vertexArraySizeGroup;
  VertexIOArraySize vertexArraySize;
  int vertexArraySizeI;
  TestCaseGroup *ioTypeGroup;
  TestCaseGroup *pTStack_8f8;
  int ndx;
  TestCaseGroup *userDefinedIOGroup;
  string primSpacWindPointName;
  undefined1 local_8c8 [3];
  bool usePointMode_1;
  int usePointModeI_1;
  undefined1 local_8a8 [8];
  string primSpacWindName;
  Winding winding_2;
  int windingI_2;
  undefined1 local_860 [8];
  string primSpacName;
  int local_838;
  SpacingMode spacing_2;
  int spacingI_6;
  bool triOrQuad;
  string primName;
  TessPrimitiveType primitiveType_6;
  int primitiveTypeI_6;
  TestCaseGroup *oneMinusTessCoordComponentGroup;
  TestCaseGroup *tessCoordComponentRangeGroup;
  TestCaseGroup *invariantOuterTriangleSetGroup;
  TestCaseGroup *invariantInnerTriangleSetGroup;
  TestCaseGroup *invariantTriangleSetGroup;
  TestCaseGroup *outerEdgeVertexSetIndexIndependenceGroup;
  TestCaseGroup *symmetricOuterEdgeGroup;
  TestCaseGroup *invariantOuterEdgeGroup;
  TestCaseGroup *invariantPrimitiveSetGroup;
  TestCaseGroup *invarianceGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  byte local_6cd;
  Winding local_6cc;
  SpacingMode SStack_6c8;
  bool usePointMode;
  Winding winding_1;
  SpacingMode spacing_1;
  TessPrimitiveType primitiveType_5;
  int usePointModeI;
  int windingI_1;
  int spacingI_5;
  int primitiveTypeI_5;
  TestCaseGroup *primitiveDiscardGroup;
  TestCaseGroup *fractionalSpacingModeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  undefined1 local_620 [8];
  string caseName_6;
  SpacingMode spacing;
  int spacingI_4;
  TessPrimitiveType primitiveType_4;
  CaseType caseType_2;
  int primitiveTypeI_4;
  int caseTypeI_2;
  TestCaseGroup *commonEdgeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  undefined1 local_558 [8];
  string caseName_5;
  int spacingI_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  undefined1 local_470 [8];
  string caseName_4;
  int spacingI_2;
  char *primTypeName_1;
  TessPrimitiveType local_438;
  TessPrimitiveType primitiveType_3;
  int primitiveTypeI_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string caseName_3;
  int spacingI_1;
  char *primTypeName;
  TessPrimitiveType primitiveType_2;
  int primitiveTypeI_2;
  TestCaseGroup *miscDrawGroup;
  char *caseName_2;
  CaseType caseType_1;
  int caseTypeI_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  char *local_298;
  char *caseName_1;
  CaseType local_288;
  CaseType caseType;
  int caseTypeI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_1a0 [8];
  string caseName;
  int local_178;
  int outSize;
  int inSize;
  int caseNdx;
  TestCaseGroup *shaderInputOutputGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  Winding local_e0;
  Winding local_dc;
  Winding winding;
  int windingI;
  TessPrimitiveType primitiveType_1;
  int primitiveTypeI_1;
  TestCaseGroup *windingGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  SpacingMode local_3c;
  TessPrimitiveType local_38;
  int spacingI;
  TessPrimitiveType primitiveType;
  int primitiveTypeI;
  TestCaseGroup *tessCoordGroup;
  TestNode *local_18;
  TestCaseGroup *queryGroup;
  TessellationTests *this_local;
  
  queryGroup = (TestCaseGroup *)this;
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "Query tests");
  local_18 = pTVar8;
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_patch_vertices",
             "Test MAX_PATCH_VERTICES",0x8e7d,0x20);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_gen_level",
             "Test MAX_TESS_GEN_LEVEL",0x8e7e,0x40);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_uniform_components",
             "Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",0x8e7f,0x400);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_uniform_components",
             "Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS",0x8e80,0x400);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_texture_image_units",
             "Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",0x8e81,0x10);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_texture_image_units",
             "Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",0x8e82,0x10);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_output_components",
             "Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",0x8e83,0x40);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_patch_components",
             "Test MAX_TESS_PATCH_COMPONENTS",0x8e84,0x78);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_total_output_components"
             ,"Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",0x8e85,0x800);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_output_components",
             "Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",0x8e86,0x40);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_uniform_blocks",
             "Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",0x8e89,0xc);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_uniform_blocks",
             "Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",0x8e8a,0xc);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_input_components",
             "Test MAX_TESS_CONTROL_INPUT_COMPONENTS",0x886c,0x40);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_input_components",
             "Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",0x886d,0x40);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_atomic_counter_buffers",
             "Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",0x92cd,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,
             "max_tess_evaluation_atomic_counter_buffers",
             "Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",0x92ce,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_atomic_counters",
             "Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",0x92d3,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_atomic_counters",
             "Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",0x92d4,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_image_uniforms",
             "Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",0x90cb,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_evaluation_image_uniforms",
             "Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",0x90cc,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_tess_control_shader_storage_blocks",
             "Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS",0x90d8,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,
             "max_tess_evaluation_shader_storage_blocks",
             "Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",0x90d9,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_uniform_buffer_bindings",
             "Test MAX_UNIFORM_BUFFER_BINDINGS",0x8a2f,0x48);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_combined_uniform_blocks",
             "Test MAX_COMBINED_UNIFORM_BLOCKS",0x8a2e,0x3c);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pLVar9 = (LimitQueryCase *)operator_new(0x80);
  anon_unknown_1::LimitQueryCase::LimitQueryCase
            (pLVar9,(this->super_TestCaseGroup).m_context,"max_combined_texture_image_units",
             "Test MAX_COMBINED_TEXTURE_IMAGE_UNITS",0x8b4d,0x60);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pLVar9);
  pTVar8 = local_18;
  pCVar10 = (CombinedUniformLimitCase *)operator_new(0x88);
  anon_unknown_1::CombinedUniformLimitCase::CombinedUniformLimitCase
            (pCVar10,(this->super_TestCaseGroup).m_context,
             "max_combined_tess_control_uniform_components",
             "Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",0x8e1e,0x8e89,0x8e7f);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pCVar10);
  pTVar8 = local_18;
  pCVar10 = (CombinedUniformLimitCase *)operator_new(0x88);
  anon_unknown_1::CombinedUniformLimitCase::CombinedUniformLimitCase
            (pCVar10,(this->super_TestCaseGroup).m_context,
             "max_combined_tess_evaluation_uniform_components",
             "Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",0x8e1f,0x8e8a,0x8e80);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pCVar10);
  pTVar8 = local_18;
  pTVar11 = (TestNode *)operator_new(0x78);
  anon_unknown_1::PrimitiveRestartForPatchesSupportedCase::PrimitiveRestartForPatchesSupportedCase
            ((PrimitiveRestartForPatchesSupportedCase *)pTVar11,
             (this->super_TestCaseGroup).m_context,"primitive_restart_for_patches_supported",
             "Test PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  pTVar8 = local_18;
  pTVar11 = (TestNode *)operator_new(0x78);
  anon_unknown_1::PatchVerticesStateCase::PatchVerticesStateCase
            ((PatchVerticesStateCase *)pTVar11,(this->super_TestCaseGroup).m_context,
             "patch_vertices","Test PATCH_VERTICES");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  pTVar8 = local_18;
  pTVar11 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessControlOutputVerticesCase::TessControlOutputVerticesCase
            ((TessControlOutputVerticesCase *)pTVar11,(this->super_TestCaseGroup).m_context,
             "tess_control_output_vertices","Test TESS_CONTROL_OUTPUT_VERTICES");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  pTVar8 = local_18;
  pTVar11 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessGenModeQueryCase::TessGenModeQueryCase
            ((TessGenModeQueryCase *)pTVar11,(this->super_TestCaseGroup).m_context,"tess_gen_mode",
             "Test TESS_GEN_MODE");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  pTVar8 = local_18;
  pTVar11 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessGenSpacingQueryCase::TessGenSpacingQueryCase
            ((TessGenSpacingQueryCase *)pTVar11,(this->super_TestCaseGroup).m_context,
             "tess_gen_spacing","Test TESS_GEN_SPACING");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  pTVar8 = local_18;
  pTVar11 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessGenVertexOrderQueryCase::TessGenVertexOrderQueryCase
            ((TessGenVertexOrderQueryCase *)pTVar11,(this->super_TestCaseGroup).m_context,
             "tess_gen_vertex_order","Test TESS_GEN_VERTEX_ORDER");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  pTVar8 = local_18;
  pTVar11 = (TestNode *)operator_new(0x78);
  anon_unknown_1::TessGenPointModeQueryCase::TessGenPointModeQueryCase
            ((TessGenPointModeQueryCase *)pTVar11,(this->super_TestCaseGroup).m_context,
             "tess_gen_point_mode","Test TESS_GEN_POINT_MODE");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  pTVar8 = local_18;
  pRVar12 = (ReferencedByTessellationQueryCase *)operator_new(0x80);
  anon_unknown_1::ReferencedByTessellationQueryCase::ReferencedByTessellationQueryCase
            (pRVar12,(this->super_TestCaseGroup).m_context,"referenced_by_tess_control_shader",
             "Test REFERENCED_BY_TESS_CONTROL_SHADER",true);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pRVar12);
  pTVar8 = local_18;
  pRVar12 = (ReferencedByTessellationQueryCase *)operator_new(0x80);
  anon_unknown_1::ReferencedByTessellationQueryCase::ReferencedByTessellationQueryCase
            (pRVar12,(this->super_TestCaseGroup).m_context,"referenced_by_tess_evaluation_shader",
             "Test REFERENCED_BY_TESS_EVALUATION_SHADER",false);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pRVar12);
  pTVar8 = local_18;
  pTVar11 = (TestNode *)operator_new(0x78);
  anon_unknown_1::IsPerPatchQueryCase::IsPerPatchQueryCase
            ((IsPerPatchQueryCase *)pTVar11,(this->super_TestCaseGroup).m_context,"is_per_patch",
             "Test IS_PER_PATCH");
  tcu::TestNode::addChild(pTVar8,pTVar11);
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"tesscoord",
             "Get tessellation coordinates with transform feedback and validate them");
  _primitiveType = pTVar13;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  for (spacingI = 0; spacingI < 3; spacingI = spacingI + 1) {
    local_38 = spacingI;
    for (local_3c = SPACINGMODE_EQUAL; pTVar13 = _primitiveType, (int)local_3c < 3;
        local_3c = local_3c + SPACINGMODE_FRACTIONAL_ODD) {
      this_00 = (TessCoordCase *)operator_new(0x90);
      windingGroup._7_1_ = 1;
      pCVar2 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string((string *)&local_c0);
      pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(local_38);
      std::operator+(&local_a0,&local_c0,pcVar14);
      std::operator+(&local_80,&local_a0,"_");
      pcVar14 = anon_unknown_1::getSpacingModeShaderName(local_3c);
      std::operator+(&local_60,&local_80,pcVar14);
      pcVar14 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::TessCoordCase::TessCoordCase(this_00,pCVar2,pcVar14,"",local_38,local_3c);
      windingGroup._7_1_ = 0;
      tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_00);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"winding",
             "Test the cw and ccw input layout qualifiers");
  _primitiveType_1 = pTVar13;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  for (windingI = 0; windingI < 3; windingI = windingI + 1) {
    winding = windingI;
    if (windingI != 2) {
      for (local_dc = WINDING_CCW; pTVar13 = _primitiveType_1, (int)local_dc < 2;
          local_dc = local_dc + WINDING_CW) {
        local_e0 = local_dc;
        this_01 = (WindingCase *)operator_new(0x90);
        shaderInputOutputGroup._7_1_ = 1;
        pCVar2 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::string::string((string *)&local_160);
        pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(winding);
        std::operator+(&local_140,&local_160,pcVar14);
        std::operator+(&local_120,&local_140,"_");
        pcVar14 = anon_unknown_1::getWindingShaderName(local_e0);
        std::operator+(&local_100,&local_120,pcVar14);
        pcVar14 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::WindingCase::WindingCase(this_01,pCVar2,pcVar14,"",winding,local_e0);
        shaderInputOutputGroup._7_1_ = 0;
        tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
      }
    }
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"shader_input_output",
             "Test tessellation control and evaluation shader inputs and outputs");
  _inSize = pTVar13;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  for (outSize = 0; outSize < 2; outSize = outSize + 1) {
    local_178 = init::patchVertexCountCases[outSize].inPatchSize;
    caseName.field_2._12_4_ = init::patchVertexCountCases[outSize].outPatchSize;
    de::toString<int>(&local_220,&local_178);
    std::operator+(&local_200,"patch_vertices_",&local_220);
    std::operator+(&local_1e0,&local_200,"_in_");
    de::toString<int>(&local_240,(int *)(caseName.field_2._M_local_buf + 0xc));
    std::operator+(&local_1c0,&local_1e0,&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                   &local_1c0,"_out");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    pTVar13 = _inSize;
    this_02 = (PatchVertexCountCase *)operator_new(0xb0);
    caseType._3_1_ = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar14 = (char *)std::__cxx11::string::c_str();
    inputPatchSize = local_178;
    uVar4 = caseName.field_2._12_4_;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&caseTypeI,
                   "data/tessellation/",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
    std::operator+(&local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&caseTypeI,
                   "_ref.png");
    pcVar15 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::PatchVertexCountCase::PatchVertexCountCase
              (this_02,pCVar2,pcVar14,"Test input and output patch vertex counts",inputPatchSize,
               uVar4,pcVar15);
    caseType._3_1_ = CASETYPE_PRIMITIVE_ID_TCS >> 0x18;
    tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::~string((string *)&caseTypeI);
    std::__cxx11::string::~string((string *)local_1a0);
  }
  for (local_288 = CASETYPE_PRIMITIVE_ID_TCS; (int)local_288 < 10;
      local_288 = local_288 + CASETYPE_PRIMITIVE_ID_TES) {
    caseName_1._4_4_ = local_288;
    local_298 = anon_unknown_1::PerPatchDataCase::getCaseTypeName(local_288);
    pTVar13 = _inSize;
    this_03 = (PerPatchDataCase *)operator_new(0xb0);
    pcVar14 = local_298;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar15 = anon_unknown_1::PerPatchDataCase::getCaseTypeDescription(caseName_1._4_4_);
    caseType_00 = caseName_1._4_4_;
    bVar7 = anon_unknown_1::PerPatchDataCase::caseTypeUsesRefImageFromFile(caseName_1._4_4_);
    if (bVar7) {
      std::__cxx11::string::string((string *)&local_318);
      std::operator+(&local_2f8,&local_318,"data/tessellation/");
      std::operator+(&local_2d8,&local_2f8,local_298);
      std::operator+(&local_2b8,&local_2d8,"_ref.png");
      local_e78 = (char *)std::__cxx11::string::c_str();
    }
    else {
      local_e78 = (char *)0x0;
    }
    anon_unknown_1::PerPatchDataCase::PerPatchDataCase
              (this_03,pCVar2,pcVar14,pcVar15,caseType_00,local_e78);
    tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_03);
    if (bVar7) {
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
    }
  }
  for (caseName_2._4_4_ = CASETYPE_VS_TO_TCS; pTVar13 = _inSize, (int)caseName_2._4_4_ < 3;
      caseName_2._4_4_ = caseName_2._4_4_ + CASETYPE_TCS_TO_TES) {
    pcVar14 = anon_unknown_1::GLPositionCase::getCaseTypeName(caseName_2._4_4_);
    pTVar13 = _inSize;
    this_04 = (GLPositionCase *)operator_new(0xb0);
    anon_unknown_1::GLPositionCase::GLPositionCase
              (this_04,(this->super_TestCaseGroup).m_context,pcVar14,"",caseName_2._4_4_,
               "data/tessellation/gl_position_ref.png");
    tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_04);
  }
  this_05 = (BarrierCase *)operator_new(0xa8);
  anon_unknown_1::BarrierCase::BarrierCase
            (this_05,(this->super_TestCaseGroup).m_context,"barrier","Basic barrier usage",
             "data/tessellation/barrier_ref.png");
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_05);
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"misc_draw",
             "Miscellaneous draw-result-verifying cases");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  for (primTypeName._4_4_ = TESSPRIMITIVETYPE_TRIANGLES; (int)primTypeName._4_4_ < 3;
      primTypeName._4_4_ = primTypeName._4_4_ + TESSPRIMITIVETYPE_QUADS) {
    if (primTypeName._4_4_ != TESSPRIMITIVETYPE_ISOLINES) {
      pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(primTypeName._4_4_);
      for (caseName_3.field_2._12_4_ = 0; (int)caseName_3.field_2._12_4_ < 3;
          caseName_3.field_2._12_4_ = caseName_3.field_2._12_4_ + 1) {
        std::__cxx11::string::string((string *)&local_3f0);
        std::operator+(&local_3d0,&local_3f0,"fill_cover_");
        std::operator+(&local_3b0,&local_3d0,pcVar14);
        std::operator+(&local_390,&local_3b0,"_");
        pcVar15 = anon_unknown_1::getSpacingModeShaderName(caseName_3.field_2._12_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_370,&local_390,pcVar15);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&local_3f0);
        pTVar8 = (TestNode *)operator_new(0xb0);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        pcVar15 = (char *)std::__cxx11::string::c_str();
        uVar4 = caseName_3.field_2._12_4_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &primitiveTypeI_3,"data/tessellation/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_370);
        std::operator+(&local_410,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &primitiveTypeI_3,"_ref");
        pcVar16 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::BasicTriangleFillCoverCase::BasicTriangleFillCoverCase
                  ((BasicTriangleFillCoverCase *)pTVar8,pCVar2,pcVar15,
                   "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape"
                   ,primTypeName._4_4_,uVar4,pcVar16);
        tcu::TestNode::addChild((TestNode *)pTVar13,pTVar8);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&primitiveTypeI_3);
        std::__cxx11::string::~string((string *)local_370);
      }
    }
  }
  for (local_438 = TESSPRIMITIVETYPE_TRIANGLES; (int)local_438 < 3;
      local_438 = local_438 + TESSPRIMITIVETYPE_QUADS) {
    if (local_438 != TESSPRIMITIVETYPE_ISOLINES) {
      pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(local_438);
      for (caseName_4.field_2._12_4_ = 0; (int)caseName_4.field_2._12_4_ < 3;
          caseName_4.field_2._12_4_ = caseName_4.field_2._12_4_ + 1) {
        std::__cxx11::string::string((string *)&local_4f0);
        std::operator+(&local_4d0,&local_4f0,"fill_overlap_");
        std::operator+(&local_4b0,&local_4d0,pcVar14);
        std::operator+(&local_490,&local_4b0,"_");
        pcVar15 = anon_unknown_1::getSpacingModeShaderName(caseName_4.field_2._12_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_470,&local_490,pcVar15);
        std::__cxx11::string::~string((string *)&local_490);
        std::__cxx11::string::~string((string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4d0);
        std::__cxx11::string::~string((string *)&local_4f0);
        pTVar8 = (TestNode *)operator_new(0xb0);
        caseName_5.field_2._M_local_buf[0xf] = '\x01';
        pCVar2 = (this->super_TestCaseGroup).m_context;
        pcVar15 = (char *)std::__cxx11::string::c_str();
        uVar4 = caseName_4.field_2._12_4_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &spacingI_3,"data/tessellation/",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_470);
        std::operator+(&local_510,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &spacingI_3,"_ref");
        pcVar16 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::BasicTriangleFillNonOverlapCase::BasicTriangleFillNonOverlapCase
                  ((BasicTriangleFillNonOverlapCase *)pTVar8,pCVar2,pcVar15,
                   "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape"
                   ,local_438,uVar4,pcVar16);
        caseName_5.field_2._M_local_buf[0xf] = '\0';
        tcu::TestNode::addChild((TestNode *)pTVar13,pTVar8);
        std::__cxx11::string::~string((string *)&local_510);
        std::__cxx11::string::~string((string *)&spacingI_3);
        std::__cxx11::string::~string((string *)local_470);
      }
    }
  }
  for (caseName_5.field_2._8_4_ = 0; (int)caseName_5.field_2._8_4_ < 3;
      caseName_5.field_2._8_4_ = caseName_5.field_2._8_4_ + 1) {
    std::__cxx11::string::string((string *)&local_598);
    std::operator+(&local_578,&local_598,"isolines_");
    pcVar14 = anon_unknown_1::getSpacingModeShaderName(caseName_5.field_2._8_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
                   &local_578,pcVar14);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    pTVar8 = (TestNode *)operator_new(0xb0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pcVar14 = (char *)std::__cxx11::string::c_str();
    uVar4 = caseName_5.field_2._8_4_;
    std::operator+(&local_5d8,"data/tessellation/",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558);
    std::operator+(&local_5b8,&local_5d8,"_ref");
    pcVar15 = (char *)std::__cxx11::string::c_str();
    anon_unknown_1::IsolinesRenderCase::IsolinesRenderCase
              ((IsolinesRenderCase *)pTVar8,pCVar2,pcVar14,"Basic isolines render test",uVar4,
               pcVar15);
    tcu::TestNode::addChild((TestNode *)pTVar13,pTVar8);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)local_558);
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"common_edge",
             "Draw multiple adjacent shapes and check that no cracks appear between them");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  for (caseType_2 = CASETYPE_BASIC; (int)caseType_2 < 2; caseType_2 = caseType_2 + CASETYPE_PRECISE)
  {
    for (primitiveType_4 = TESSPRIMITIVETYPE_TRIANGLES; (int)primitiveType_4 < 3;
        primitiveType_4 = primitiveType_4 + TESSPRIMITIVETYPE_QUADS) {
      if (primitiveType_4 != TESSPRIMITIVETYPE_ISOLINES) {
        for (caseName_6.field_2._12_4_ = 0; (int)caseName_6.field_2._12_4_ < 3;
            caseName_6.field_2._12_4_ = caseName_6.field_2._12_4_ + 1) {
          caseName_6.field_2._8_4_ = caseName_6.field_2._12_4_;
          std::__cxx11::string::string((string *)&fractionalSpacingModeGroup);
          pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(primitiveType_4);
          std::operator+(&local_680,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fractionalSpacingModeGroup,pcVar14);
          std::operator+(&local_660,&local_680,"_");
          pcVar14 = anon_unknown_1::getSpacingModeShaderName(caseName_6.field_2._8_4_);
          std::operator+(&local_640,&local_660,pcVar14);
          if (caseType_2 == CASETYPE_BASIC) {
            local_f80 = "";
          }
          else {
            local_f80 = (char *)0x0;
            if (caseType_2 == CASETYPE_PRECISE) {
              local_f80 = "_precise";
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_620,&local_640,local_f80);
          std::__cxx11::string::~string((string *)&local_640);
          std::__cxx11::string::~string((string *)&local_660);
          std::__cxx11::string::~string((string *)&local_680);
          std::__cxx11::string::~string((string *)&fractionalSpacingModeGroup);
          this_06 = (CommonEdgeCase *)operator_new(0x98);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar14 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::CommonEdgeCase::CommonEdgeCase
                    (this_06,pCVar2,pcVar14,"",primitiveType_4,caseName_6.field_2._8_4_,caseType_2);
          tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_06);
          std::__cxx11::string::~string((string *)local_620);
        }
      }
    }
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"fractional_spacing",
             "Test fractional spacing modes");
  primitiveDiscardGroup = pTVar13;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  pTVar13 = primitiveDiscardGroup;
  pFVar17 = (FractionalSpacingModeCase *)operator_new(0x90);
  anon_unknown_1::FractionalSpacingModeCase::FractionalSpacingModeCase
            (pFVar17,(this->super_TestCaseGroup).m_context,"odd","",SPACINGMODE_FRACTIONAL_ODD);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pFVar17);
  pTVar13 = primitiveDiscardGroup;
  pFVar17 = (FractionalSpacingModeCase *)operator_new(0x90);
  anon_unknown_1::FractionalSpacingModeCase::FractionalSpacingModeCase
            (pFVar17,(this->super_TestCaseGroup).m_context,"even","",SPACINGMODE_FRACTIONAL_EVEN);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pFVar17);
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"primitive_discard",
             "Test primitive discard with relevant outer tessellation level <= 0.0");
  _spacingI_5 = pTVar13;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  for (windingI_1 = 0; windingI_1 < 3; windingI_1 = windingI_1 + 1) {
    for (usePointModeI = 0; usePointModeI < 3; usePointModeI = usePointModeI + 1) {
      for (primitiveType_5 = TESSPRIMITIVETYPE_TRIANGLES; (int)primitiveType_5 < 2;
          primitiveType_5 = primitiveType_5 + TESSPRIMITIVETYPE_QUADS) {
        for (spacing_1 = SPACINGMODE_EQUAL; pTVar13 = _spacingI_5, (int)spacing_1 < 2;
            spacing_1 = spacing_1 + SPACINGMODE_FRACTIONAL_ODD) {
          winding_1 = windingI_1;
          SStack_6c8 = usePointModeI;
          local_6cc = primitiveType_5;
          local_6cd = spacing_1 != SPACINGMODE_EQUAL;
          this_07 = (PrimitiveDiscardCase *)operator_new(0x98);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          std::__cxx11::string::string((string *)&local_7b0);
          pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(winding_1);
          std::operator+(&local_790,&local_7b0,pcVar14);
          std::operator+(&local_770,&local_790,"_");
          pcVar14 = anon_unknown_1::getSpacingModeShaderName(SStack_6c8);
          std::operator+(&local_750,&local_770,pcVar14);
          std::operator+(&local_730,&local_750,"_");
          pcVar14 = anon_unknown_1::getWindingShaderName(local_6cc);
          std::operator+(&local_710,&local_730,pcVar14);
          pcVar14 = "";
          if ((local_6cd & 1) != 0) {
            pcVar14 = "_point_mode";
          }
          std::operator+(&local_6f0,&local_710,pcVar14);
          pcVar14 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::PrimitiveDiscardCase::PrimitiveDiscardCase
                    (this_07,pCVar2,pcVar14,"",winding_1,SStack_6c8,local_6cc,(bool)(local_6cd & 1))
          ;
          tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_07);
          std::__cxx11::string::~string((string *)&local_6f0);
          std::__cxx11::string::~string((string *)&local_710);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::string::~string((string *)&local_750);
          std::__cxx11::string::~string((string *)&local_770);
          std::__cxx11::string::~string((string *)&local_790);
          std::__cxx11::string::~string((string *)&local_7b0);
        }
      }
    }
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"invariance",
             "Test tessellation invariance rules");
  pTVar18 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar18,(this->super_TestCaseGroup).m_context,"primitive_set","Test invariance rule #1"
            );
  this_08 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_08,(this->super_TestCaseGroup).m_context,"outer_edge_division",
             "Test invariance rule #2");
  this_09 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_09,(this->super_TestCaseGroup).m_context,"outer_edge_symmetry",
             "Test invariance rule #3");
  this_10 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_10,(this->super_TestCaseGroup).m_context,"outer_edge_index_independence",
             "Test invariance rule #4");
  this_11 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_11,(this->super_TestCaseGroup).m_context,"triangle_set","Test invariance rule #5")
  ;
  this_12 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_12,(this->super_TestCaseGroup).m_context,"inner_triangle_set",
             "Test invariance rule #6");
  this_13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_13,(this->super_TestCaseGroup).m_context,"outer_triangle_set",
             "Test invariance rule #7");
  this_14 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_14,(this->super_TestCaseGroup).m_context,"tess_coord_component_range",
             "Test invariance rule #8, first part");
  this_15 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_15,(this->super_TestCaseGroup).m_context,"one_minus_tess_coord_component",
             "Test invariance rule #8, second part");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pTVar18);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_08);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_09);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_10);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_11);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_12);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_13);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_14);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)this_15);
  for (primName.field_2._12_4_ = 0; (int)primName.field_2._12_4_ < 3;
      primName.field_2._12_4_ = primName.field_2._12_4_ + 1) {
    primName.field_2._8_4_ = primName.field_2._12_4_;
    pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(primName.field_2._12_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&spacingI_6,pcVar14,(allocator<char> *)((long)&spacing_2 + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&spacing_2 + 3));
    local_1059 = (uint)primName.field_2._8_4_ < 2;
    spacing_2._2_1_ = local_1059;
    for (local_838 = 0; local_838 < 3; local_838 = local_838 + 1) {
      primSpacName.field_2._12_4_ = local_838;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&winding_2
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &spacingI_6,"_");
      pcVar14 = anon_unknown_1::getSpacingModeShaderName(primSpacName.field_2._12_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_860,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&winding_2
                     ,pcVar14);
      std::__cxx11::string::~string((string *)&winding_2);
      if ((spacing_2._2_1_ & 1) != SPACINGMODE_EQUAL >> 0x10) {
        this_16 = (InvariantOuterEdgeCase *)operator_new(0x98);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        pcVar14 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::InvariantOuterEdgeCase::InvariantOuterEdgeCase
                  (this_16,pCVar2,pcVar14,"",primName.field_2._8_4_,primSpacName.field_2._12_4_);
        tcu::TestNode::addChild((TestNode *)this_08,(TestNode *)this_16);
        pTVar8 = (TestNode *)operator_new(0xa0);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        pcVar14 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::InvariantTriangleSetCase::InvariantTriangleSetCase
                  ((InvariantTriangleSetCase *)pTVar8,pCVar2,pcVar14,"",primName.field_2._8_4_,
                   primSpacName.field_2._12_4_);
        tcu::TestNode::addChild((TestNode *)this_11,pTVar8);
        pTVar8 = (TestNode *)operator_new(0xa0);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        pcVar14 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::InvariantInnerTriangleSetCase::InvariantInnerTriangleSetCase
                  ((InvariantInnerTriangleSetCase *)pTVar8,pCVar2,pcVar14,"",primName.field_2._8_4_,
                   primSpacName.field_2._12_4_);
        tcu::TestNode::addChild((TestNode *)this_12,pTVar8);
        pTVar8 = (TestNode *)operator_new(0xa0);
        pCVar2 = (this->super_TestCaseGroup).m_context;
        pcVar14 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::InvariantOuterTriangleSetCase::InvariantOuterTriangleSetCase
                  ((InvariantOuterTriangleSetCase *)pTVar8,pCVar2,pcVar14,"",primName.field_2._8_4_,
                   primSpacName.field_2._12_4_);
        tcu::TestNode::addChild((TestNode *)this_13,pTVar8);
      }
      for (primSpacWindName.field_2._12_4_ = 0; (int)primSpacWindName.field_2._12_4_ < 2;
          primSpacWindName.field_2._12_4_ = primSpacWindName.field_2._12_4_ + 1) {
        primSpacWindName.field_2._8_4_ = primSpacWindName.field_2._12_4_;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_860,"_");
        pcVar14 = anon_unknown_1::getWindingShaderName(primSpacWindName.field_2._8_4_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_8c8,pcVar14);
        std::__cxx11::string::~string((string *)local_8c8);
        for (primSpacWindPointName.field_2._12_4_ = 0; (int)primSpacWindPointName.field_2._12_4_ < 2
            ; primSpacWindPointName.field_2._12_4_ = primSpacWindPointName.field_2._12_4_ + 1) {
          primSpacWindPointName.field_2._M_local_buf[0xb] =
               primSpacWindPointName.field_2._12_4_ != 0;
          pcVar14 = "";
          if ((bool)primSpacWindPointName.field_2._M_local_buf[0xb]) {
            pcVar14 = "_point_mode";
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &userDefinedIOGroup,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_8a8,pcVar14);
          pTVar8 = (TestNode *)operator_new(0xa0);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar14 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::InvariantPrimitiveSetCase::InvariantPrimitiveSetCase
                    ((InvariantPrimitiveSetCase *)pTVar8,pCVar2,pcVar14,"",primName.field_2._8_4_,
                     primSpacName.field_2._12_4_,primSpacWindName.field_2._8_4_,
                     (bool)(primSpacWindPointName.field_2._M_local_buf[0xb] & 1));
          tcu::TestNode::addChild((TestNode *)pTVar18,pTVar8);
          this_17 = (SymmetricOuterEdgeCase *)operator_new(0x98);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar14 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::SymmetricOuterEdgeCase::SymmetricOuterEdgeCase
                    (this_17,pCVar2,pcVar14,"",primName.field_2._8_4_,primSpacName.field_2._12_4_,
                     primSpacWindName.field_2._8_4_,
                     (bool)(primSpacWindPointName.field_2._M_local_buf[0xb] & 1));
          tcu::TestNode::addChild((TestNode *)this_09,(TestNode *)this_17);
          pTVar8 = (TestNode *)operator_new(0x98);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar14 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::TessCoordComponentRangeCase::TessCoordComponentRangeCase
                    ((TessCoordComponentRangeCase *)pTVar8,pCVar2,pcVar14,"",primName.field_2._8_4_,
                     primSpacName.field_2._12_4_,primSpacWindName.field_2._8_4_,
                     (bool)(primSpacWindPointName.field_2._M_local_buf[0xb] & 1));
          tcu::TestNode::addChild((TestNode *)this_14,pTVar8);
          pTVar8 = (TestNode *)operator_new(0x98);
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar14 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::OneMinusTessCoordComponentCase::OneMinusTessCoordComponentCase
                    ((OneMinusTessCoordComponentCase *)pTVar8,pCVar2,pcVar14,"",
                     primName.field_2._8_4_,primSpacName.field_2._12_4_,
                     primSpacWindName.field_2._8_4_,
                     (bool)(primSpacWindPointName.field_2._M_local_buf[0xb] & 1));
          tcu::TestNode::addChild((TestNode *)this_15,pTVar8);
          if ((spacing_2._2_1_ & 1) != SPACINGMODE_EQUAL >> 0x10) {
            this_18 = (OuterEdgeVertexSetIndexIndependenceCase *)operator_new(0x98);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar14 = (char *)std::__cxx11::string::c_str();
            anon_unknown_1::OuterEdgeVertexSetIndexIndependenceCase::
            OuterEdgeVertexSetIndexIndependenceCase
                      (this_18,pCVar2,pcVar14,"",primName.field_2._8_4_,primSpacName.field_2._12_4_,
                       primSpacWindName.field_2._8_4_,
                       (bool)(primSpacWindPointName.field_2._M_local_buf[0xb] & 1));
            tcu::TestNode::addChild((TestNode *)this_10,(TestNode *)this_18);
          }
          std::__cxx11::string::~string((string *)&userDefinedIOGroup);
        }
        std::__cxx11::string::~string((string *)local_8a8);
      }
      std::__cxx11::string::~string((string *)local_860);
    }
    std::__cxx11::string::~string((string *)&spacingI_6);
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"user_defined_io",
             "Test non-built-in per-patch and per-vertex inputs and outputs");
  pTStack_8f8 = pTVar13;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar13);
  for (ioTypeGroup._4_4_ = 0; ioTypeGroup._4_4_ < 6; ioTypeGroup._4_4_ = ioTypeGroup._4_4_ + 1) {
    pTVar13 = (TestCaseGroup *)operator_new(0x78);
    TestCaseGroup::TestCaseGroup
              (pTVar13,(this->super_TestCaseGroup).m_context,init::ioCases[ioTypeGroup._4_4_].name,
               init::ioCases[ioTypeGroup._4_4_].description);
    _vertexArraySize = pTVar13;
    tcu::TestNode::addChild((TestNode *)pTStack_8f8,(TestNode *)pTVar13);
    for (vertexArraySizeGroup._4_4_ = VERTEX_IO_ARRAY_SIZE_IMPLICIT;
        (int)vertexArraySizeGroup._4_4_ < 3;
        vertexArraySizeGroup._4_4_ =
             vertexArraySizeGroup._4_4_ + VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
      vertexArraySizeGroup._0_4_ = vertexArraySizeGroup._4_4_;
      pTVar13 = (TestCaseGroup *)operator_new(0x78);
      if (vertexArraySizeGroup._4_4_ == VERTEX_IO_ARRAY_SIZE_IMPLICIT) {
        local_1170 = "vertex_io_array_size_implicit";
      }
      else {
        if (vertexArraySizeGroup._4_4_ == VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN) {
          local_1178 = "vertex_io_array_size_shader_builtin";
        }
        else {
          local_1178 = (char *)0x0;
          if (vertexArraySizeGroup._4_4_ == VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY) {
            local_1178 = "vertex_io_array_size_query";
          }
        }
        local_1170 = local_1178;
      }
      TestCaseGroup::TestCaseGroup(pTVar13,(this->super_TestCaseGroup).m_context,local_1170,"");
      _primitiveType_7 = pTVar13;
      tcu::TestNode::addChild((TestNode *)_vertexArraySize,(TestNode *)pTVar13);
      for (local_91c = TESSPRIMITIVETYPE_TRIANGLES; pTVar13 = _primitiveType_7, (int)local_91c < 3;
          local_91c = local_91c + TESSPRIMITIVETYPE_QUADS) {
        local_920 = local_91c;
        pUVar19 = (UserDefinedIOCase *)operator_new(0x100);
        primitiveType_8._3_1_ = 1;
        pCVar2 = (this->super_TestCaseGroup).m_context;
        pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(local_920);
        VVar6 = (VertexIOArraySize)vertexArraySizeGroup;
        TVar5 = local_920;
        IVar1 = init::ioCases[ioTypeGroup._4_4_].ioType;
        std::__cxx11::string::string((string *)&primitiveTypeI_8);
        std::operator+(&local_980,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &primitiveTypeI_8,"data/tessellation/user_defined_io_");
        pcVar15 = anon_unknown_1::getTessPrimitiveTypeShaderName(local_920);
        std::operator+(&local_960,&local_980,pcVar15);
        std::operator+(&local_940,&local_960,"_ref.png");
        pcVar15 = (char *)std::__cxx11::string::c_str();
        anon_unknown_1::UserDefinedIOCase::UserDefinedIOCase
                  (pUVar19,pCVar2,pcVar14,"",TVar5,IVar1,VVar6,TESS_CONTROL_OUT_ARRAY_SIZE_IMPLICIT,
                   pcVar15);
        primitiveType_8._3_1_ = TESSPRIMITIVETYPE_TRIANGLES >> 0x18;
        tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pUVar19);
        std::__cxx11::string::~string((string *)&local_940);
        std::__cxx11::string::~string((string *)&local_960);
        std::__cxx11::string::~string((string *)&local_980);
        std::__cxx11::string::~string((string *)&primitiveTypeI_8);
      }
      if ((init::ioCases[ioTypeGroup._4_4_].ioType == IO_TYPE_PER_VERTEX) ||
         (init::ioCases[ioTypeGroup._4_4_].ioType == IO_TYPE_PER_VERTEX_BLOCK)) {
        for (local_9a8 = TESSPRIMITIVETYPE_TRIANGLES; pTVar13 = _primitiveType_7, (int)local_9a8 < 3
            ; local_9a8 = local_9a8 + TESSPRIMITIVETYPE_QUADS) {
          local_9ac = local_9a8;
          pUVar19 = (UserDefinedIOCase *)operator_new(0x100);
          negativeGroup.
          super_UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
          .m_data._15_1_ = 1;
          pCVar2 = (this->super_TestCaseGroup).m_context;
          pcVar14 = anon_unknown_1::getTessPrimitiveTypeShaderName(local_9ac);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_9f0,pcVar14,&local_9f1);
          std::operator+(&local_9d0,&local_9f0,"_explicit_tcs_out_size");
          pcVar14 = (char *)std::__cxx11::string::c_str();
          VVar6 = (VertexIOArraySize)vertexArraySizeGroup;
          TVar5 = local_9ac;
          IVar1 = init::ioCases[ioTypeGroup._4_4_].ioType;
          std::__cxx11::string::string((string *)&local_a78);
          std::operator+(&local_a58,&local_a78,"data/tessellation/user_defined_io_");
          pcVar15 = anon_unknown_1::getTessPrimitiveTypeShaderName(local_9ac);
          std::operator+(&local_a38,&local_a58,pcVar15);
          std::operator+(&local_a18,&local_a38,"_ref.png");
          pcVar15 = (char *)std::__cxx11::string::c_str();
          anon_unknown_1::UserDefinedIOCase::UserDefinedIOCase
                    (pUVar19,pCVar2,pcVar14,"",TVar5,IVar1,VVar6,TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT,
                     pcVar15);
          negativeGroup.
          super_UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
          .m_data._15_1_ = 0;
          tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pUVar19);
          std::__cxx11::string::~string((string *)&local_a18);
          std::__cxx11::string::~string((string *)&local_a38);
          std::__cxx11::string::~string((string *)&local_a58);
          std::__cxx11::string::~string((string *)&local_a78);
          std::__cxx11::string::~string((string *)&local_9d0);
          std::__cxx11::string::~string((string *)&local_9f0);
          std::allocator<char>::~allocator(&local_9f1);
        }
      }
    }
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"negative","Negative cases");
  de::DefaultDeleter<deqp::gles31::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<deqp::gles31::TestCaseGroup> *)
             &es31Group.
              super_UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              .m_data.field_0xf);
  de::details::
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::MovePtr
            ((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              *)local_a90,pTVar13);
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"es31","GLSL ES 3.1 Negative cases");
  de::DefaultDeleter<deqp::gles31::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<deqp::gles31::TestCaseGroup> *)((long)&shaderLibrary.m_contextInfo + 7)
            );
  de::details::
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::MovePtr
            ((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              *)local_aa8,pTVar13);
  pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar20 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar21 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,pTVar3,pRVar20,pCVar21);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_ae0,
             (ShaderLibrary *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             "shaders/es31/tessellation_negative_user_defined_io.test");
  for (es32Group.
       super_UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
       .m_data._12_4_ = 0;
      uVar4 = es32Group.
              super_UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              .m_data._12_4_,
      sVar22 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_ae0),
      (int)uVar4 < (int)sVar22;
      es32Group.
      super_UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
      .m_data._12_4_ =
           es32Group.
           super_UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
           .m_data._12_4_ + 1) {
    pTVar13 = de::details::
              UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              ::operator->((UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
                            *)local_aa8);
    ppTVar23 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_ae0,
                          (long)(int)es32Group.
                                     super_UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
                                     .m_data._12_4_);
    tcu::TestNode::addChild((TestNode *)pTVar13,*ppTVar23);
  }
  pTVar13 = de::details::
            UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
            ::operator->((UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
                          *)local_a90);
  pTVar18 = de::details::
            MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::
            release((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
                     *)local_aa8);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pTVar18);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_ae0);
  deqp::gls::ShaderLibrary::~ShaderLibrary
            ((ShaderLibrary *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  de::details::
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::~MovePtr
            ((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              *)local_aa8);
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(this->super_TestCaseGroup).m_context,"es32","GLSL ES 3.2 Negative cases");
  de::DefaultDeleter<deqp::gles31::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<deqp::gles31::TestCaseGroup> *)
             ((long)&shaderLibrary_1.m_contextInfo + 7));
  de::details::
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::MovePtr
            ((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              *)local_af8,pTVar13);
  pTVar3 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
  pRVar20 = gles31::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  pCVar21 = gles31::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  deqp::gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)
             &children_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pTVar3,pRVar20,pCVar21);
  deqp::gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b30,
             (ShaderLibrary *)
             &children_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             "shaders/es32/tessellation_negative_user_defined_io.test");
  for (local_b34 = 0;
      sVar22 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b30),
      local_b34 < (int)sVar22; local_b34 = local_b34 + 1) {
    pTVar13 = de::details::
              UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              ::operator->((UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
                            *)local_af8);
    ppTVar23 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b30,
                          (long)local_b34);
    tcu::TestNode::addChild((TestNode *)pTVar13,*ppTVar23);
  }
  pTVar13 = de::details::
            UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
            ::operator->((UniqueBase<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
                          *)local_a90);
  pTVar18 = de::details::
            MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::
            release((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
                     *)local_af8);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pTVar18);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_b30);
  deqp::gls::ShaderLibrary::~ShaderLibrary
            ((ShaderLibrary *)
             &children_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  de::details::
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::~MovePtr
            ((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              *)local_af8);
  pTVar13 = pTStack_8f8;
  pTVar18 = de::details::
            MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::
            release((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
                     *)local_a90);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pTVar18);
  de::details::
  MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>::~MovePtr
            ((MovePtr<deqp::gles31::TestCaseGroup,_de::DefaultDeleter<deqp::gles31::TestCaseGroup>_>
              *)local_a90);
  return extraout_EAX;
}

Assistant:

void TessellationTests::init (void)
{
	{
		tcu::TestCaseGroup* const queryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "Query tests");
		addChild(queryGroup);

		// new limits
		queryGroup->addChild(new LimitQueryCase(m_context, "max_patch_vertices",								"Test MAX_PATCH_VERTICES",								GL_MAX_PATCH_VERTICES,							32));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_gen_level",								"Test MAX_TESS_GEN_LEVEL",								GL_MAX_TESS_GEN_LEVEL,							64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_uniform_components",				"Test MAX_TESS_CONTROL_UNIFORM_COMPONENTS",				GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS,			1024));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_uniform_components",			"Test MAX_TESS_EVALUATION_UNIFORM_COMPONENTS",			GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS,		1024));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_texture_image_units",				"Test MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS",			GL_MAX_TESS_CONTROL_TEXTURE_IMAGE_UNITS,		16));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_texture_image_units",			"Test MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS",			GL_MAX_TESS_EVALUATION_TEXTURE_IMAGE_UNITS,		16));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_output_components",				"Test MAX_TESS_CONTROL_OUTPUT_COMPONENTS",				GL_MAX_TESS_CONTROL_OUTPUT_COMPONENTS,			64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_patch_components",							"Test MAX_TESS_PATCH_COMPONENTS",						GL_MAX_TESS_PATCH_COMPONENTS,					120));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_total_output_components",			"Test MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS",		GL_MAX_TESS_CONTROL_TOTAL_OUTPUT_COMPONENTS,	2048));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_output_components",				"Test MAX_TESS_EVALUATION_OUTPUT_COMPONENTS",			GL_MAX_TESS_EVALUATION_OUTPUT_COMPONENTS,		64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_uniform_blocks",					"Test MAX_TESS_CONTROL_UNIFORM_BLOCKS",					GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,				12));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_uniform_blocks",				"Test MAX_TESS_EVALUATION_UNIFORM_BLOCKS",				GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,			12));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_input_components",					"Test MAX_TESS_CONTROL_INPUT_COMPONENTS",				GL_MAX_TESS_CONTROL_INPUT_COMPONENTS,			64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_input_components",				"Test MAX_TESS_EVALUATION_INPUT_COMPONENTS",			GL_MAX_TESS_EVALUATION_INPUT_COMPONENTS,		64));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_atomic_counter_buffers",			"Test MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS",			GL_MAX_TESS_CONTROL_ATOMIC_COUNTER_BUFFERS,		0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_atomic_counter_buffers",		"Test MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS",		GL_MAX_TESS_EVALUATION_ATOMIC_COUNTER_BUFFERS,	0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_atomic_counters",					"Test MAX_TESS_CONTROL_ATOMIC_COUNTERS",				GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_atomic_counters",				"Test MAX_TESS_EVALUATION_ATOMIC_COUNTERS",				GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_image_uniforms",					"Test MAX_TESS_CONTROL_IMAGE_UNIFORMS",					GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS,				0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_image_uniforms",				"Test MAX_TESS_EVALUATION_IMAGE_UNIFORMS",				GL_MAX_TESS_EVALUATION_IMAGE_UNIFORMS,			0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_control_shader_storage_blocks",			"Test MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS",			GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS,		0));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_tess_evaluation_shader_storage_blocks",			"Test MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS",		GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS,	0));

		// modified limits
		queryGroup->addChild(new LimitQueryCase(m_context, "max_uniform_buffer_bindings",						"Test MAX_UNIFORM_BUFFER_BINDINGS",						GL_MAX_UNIFORM_BUFFER_BINDINGS,					72));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_combined_uniform_blocks",						"Test MAX_COMBINED_UNIFORM_BLOCKS",						GL_MAX_COMBINED_UNIFORM_BLOCKS,					60));
		queryGroup->addChild(new LimitQueryCase(m_context, "max_combined_texture_image_units",					"Test MAX_COMBINED_TEXTURE_IMAGE_UNITS",				GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,			96));

		// combined limits
		queryGroup->addChild(new CombinedUniformLimitCase(m_context, "max_combined_tess_control_uniform_components",		"Test MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_CONTROL_UNIFORM_COMPONENTS,		GL_MAX_TESS_CONTROL_UNIFORM_BLOCKS,		GL_MAX_TESS_CONTROL_UNIFORM_COMPONENTS));
		queryGroup->addChild(new CombinedUniformLimitCase(m_context, "max_combined_tess_evaluation_uniform_components",		"Test MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS",	GL_MAX_COMBINED_TESS_EVALUATION_UNIFORM_COMPONENTS,		GL_MAX_TESS_EVALUATION_UNIFORM_BLOCKS,	GL_MAX_TESS_EVALUATION_UNIFORM_COMPONENTS));

		// features
		queryGroup->addChild(new PrimitiveRestartForPatchesSupportedCase(m_context, "primitive_restart_for_patches_supported", "Test PRIMITIVE_RESTART_FOR_PATCHES_SUPPORTED"));

		// states
		queryGroup->addChild(new PatchVerticesStateCase(m_context, "patch_vertices", "Test PATCH_VERTICES"));

		// program states
		queryGroup->addChild(new TessControlOutputVerticesCase	(m_context, "tess_control_output_vertices",	"Test TESS_CONTROL_OUTPUT_VERTICES"));
		queryGroup->addChild(new TessGenModeQueryCase			(m_context, "tess_gen_mode",				"Test TESS_GEN_MODE"));
		queryGroup->addChild(new TessGenSpacingQueryCase		(m_context, "tess_gen_spacing",				"Test TESS_GEN_SPACING"));
		queryGroup->addChild(new TessGenVertexOrderQueryCase	(m_context, "tess_gen_vertex_order",		"Test TESS_GEN_VERTEX_ORDER"));
		queryGroup->addChild(new TessGenPointModeQueryCase		(m_context, "tess_gen_point_mode",			"Test TESS_GEN_POINT_MODE"));

		// resource queries
		queryGroup->addChild(new ReferencedByTessellationQueryCase	(m_context, "referenced_by_tess_control_shader",	"Test REFERENCED_BY_TESS_CONTROL_SHADER",		true));
		queryGroup->addChild(new ReferencedByTessellationQueryCase	(m_context, "referenced_by_tess_evaluation_shader",	"Test REFERENCED_BY_TESS_EVALUATION_SHADER",	false));
		queryGroup->addChild(new IsPerPatchQueryCase				(m_context, "is_per_patch",							"Test IS_PER_PATCH"));
	}

	{
		TestCaseGroup* const tessCoordGroup = new TestCaseGroup(m_context, "tesscoord", "Get tessellation coordinates with transform feedback and validate them");
		addChild(tessCoordGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
				tessCoordGroup->addChild(new TessCoordCase(m_context,
														   (string() + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName((SpacingMode)spacingI)).c_str(), "",
														   primitiveType, (SpacingMode)spacingI));
		}
	}

	{
		TestCaseGroup* const windingGroup = new TestCaseGroup(m_context, "winding", "Test the cw and ccw input layout qualifiers");
		addChild(windingGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			for (int windingI = 0; windingI < WINDING_LAST; windingI++)
			{
				const Winding winding = (Winding)windingI;
				windingGroup->addChild(new WindingCase(m_context, (string() + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getWindingShaderName(winding)).c_str(), "", primitiveType, winding));
			}
		}
	}

	{
		TestCaseGroup* const shaderInputOutputGroup = new TestCaseGroup(m_context, "shader_input_output", "Test tessellation control and evaluation shader inputs and outputs");
		addChild(shaderInputOutputGroup);

		{
			static const struct
			{
				int inPatchSize;
				int outPatchSize;
			} patchVertexCountCases[] =
			{
				{  5, 10 },
				{ 10,  5 }
			};

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(patchVertexCountCases); caseNdx++)
			{
				const int inSize	= patchVertexCountCases[caseNdx].inPatchSize;
				const int outSize	= patchVertexCountCases[caseNdx].outPatchSize;

				const string caseName = "patch_vertices_" + de::toString(inSize) + "_in_" + de::toString(outSize) + "_out";

				shaderInputOutputGroup->addChild(new PatchVertexCountCase(m_context, caseName.c_str(), "Test input and output patch vertex counts", inSize, outSize,
																		  ("data/tessellation/" + caseName + "_ref.png").c_str()));
			}
		}

		for (int caseTypeI = 0; caseTypeI < PerPatchDataCase::CASETYPE_LAST; caseTypeI++)
		{
			const PerPatchDataCase::CaseType	caseType	= (PerPatchDataCase::CaseType)caseTypeI;
			const char* const					caseName	= PerPatchDataCase::getCaseTypeName(caseType);

			shaderInputOutputGroup->addChild(new PerPatchDataCase(m_context, caseName, PerPatchDataCase::getCaseTypeDescription(caseType), caseType,
																  PerPatchDataCase::caseTypeUsesRefImageFromFile(caseType) ? (string() + "data/tessellation/" + caseName + "_ref.png").c_str() : DE_NULL));
		}

		for (int caseTypeI = 0; caseTypeI < GLPositionCase::CASETYPE_LAST; caseTypeI++)
		{
			const GLPositionCase::CaseType	caseType	= (GLPositionCase::CaseType)caseTypeI;
			const char* const				caseName	= GLPositionCase::getCaseTypeName(caseType);

			shaderInputOutputGroup->addChild(new GLPositionCase(m_context, caseName, "", caseType, "data/tessellation/gl_position_ref.png"));
		}

		shaderInputOutputGroup->addChild(new BarrierCase(m_context, "barrier", "Basic barrier usage", "data/tessellation/barrier_ref.png"));
	}

	{
		TestCaseGroup* const miscDrawGroup = new TestCaseGroup(m_context, "misc_draw", "Miscellaneous draw-result-verifying cases");
		addChild(miscDrawGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			const char* const primTypeName = getTessPrimitiveTypeShaderName(primitiveType);

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const string caseName = string() + "fill_cover_" + primTypeName + "_" + getSpacingModeShaderName((SpacingMode)spacingI);

				miscDrawGroup->addChild(new BasicTriangleFillCoverCase(m_context,
																	   caseName.c_str(), "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape",
																	   primitiveType, (SpacingMode)spacingI,
																	   ("data/tessellation/" + caseName + "_ref").c_str()));
			}
		}

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
			if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				continue;

			const char* const primTypeName = getTessPrimitiveTypeShaderName(primitiveType);

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const string caseName = string() + "fill_overlap_" + primTypeName + "_" + getSpacingModeShaderName((SpacingMode)spacingI);

				miscDrawGroup->addChild(new BasicTriangleFillNonOverlapCase(m_context,
																			caseName.c_str(), "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape",
																			primitiveType, (SpacingMode)spacingI,
																			("data/tessellation/" + caseName + "_ref").c_str()));
			}
		}

		for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
		{
			const string caseName = string() + "isolines_" + getSpacingModeShaderName((SpacingMode)spacingI);

			miscDrawGroup->addChild(new IsolinesRenderCase(m_context,
														   caseName.c_str(), "Basic isolines render test",
														   (SpacingMode)spacingI,
														   ("data/tessellation/" + caseName + "_ref").c_str()));
		}
	}

	{
		TestCaseGroup* const commonEdgeGroup = new TestCaseGroup(m_context, "common_edge", "Draw multiple adjacent shapes and check that no cracks appear between them");
		addChild(commonEdgeGroup);

		for (int caseTypeI = 0; caseTypeI < CommonEdgeCase::CASETYPE_LAST; caseTypeI++)
		{
			for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
			{
				const CommonEdgeCase::CaseType	caseType		= (CommonEdgeCase::CaseType)caseTypeI;
				const TessPrimitiveType			primitiveType	= (TessPrimitiveType)primitiveTypeI;
				if (primitiveType == TESSPRIMITIVETYPE_ISOLINES)
						continue;

				for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
				{
					const SpacingMode	spacing		= (SpacingMode)spacingI;
					const string		caseName	= (string() + getTessPrimitiveTypeShaderName(primitiveType)
																+ "_" + getSpacingModeShaderName(spacing)
																+ (caseType == CommonEdgeCase::CASETYPE_BASIC		? ""
																 : caseType == CommonEdgeCase::CASETYPE_PRECISE		? "_precise"
																 : DE_NULL));

					commonEdgeGroup->addChild(new CommonEdgeCase(m_context, caseName.c_str(), "", primitiveType, spacing, caseType));
				}
			}
		}
	}

	{
		TestCaseGroup* const fractionalSpacingModeGroup = new TestCaseGroup(m_context, "fractional_spacing", "Test fractional spacing modes");
		addChild(fractionalSpacingModeGroup);

		fractionalSpacingModeGroup->addChild(new FractionalSpacingModeCase(m_context, "odd",	"", SPACINGMODE_FRACTIONAL_ODD));
		fractionalSpacingModeGroup->addChild(new FractionalSpacingModeCase(m_context, "even",	"", SPACINGMODE_FRACTIONAL_EVEN));
	}

	{
		TestCaseGroup* const primitiveDiscardGroup = new TestCaseGroup(m_context, "primitive_discard", "Test primitive discard with relevant outer tessellation level <= 0.0");
		addChild(primitiveDiscardGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				for (int windingI = 0; windingI < WINDING_LAST; windingI++)
				{
					for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
					{
						const TessPrimitiveType		primitiveType	= (TessPrimitiveType)primitiveTypeI;
						const SpacingMode			spacing			= (SpacingMode)spacingI;
						const Winding				winding			= (Winding)windingI;
						const bool					usePointMode	= usePointModeI != 0;

						primitiveDiscardGroup->addChild(new PrimitiveDiscardCase(m_context, (string() + getTessPrimitiveTypeShaderName(primitiveType)
																									  + "_" + getSpacingModeShaderName(spacing)
																									  + "_" + getWindingShaderName(winding)
																									  + (usePointMode ? "_point_mode" : "")).c_str(), "",
																				 primitiveType, spacing, winding, usePointMode));
					}
				}
			}
		}
	}

	{
		TestCaseGroup* const invarianceGroup							= new TestCaseGroup(m_context, "invariance",						"Test tessellation invariance rules");

		TestCaseGroup* const invariantPrimitiveSetGroup					= new TestCaseGroup(m_context, "primitive_set",						"Test invariance rule #1");
		TestCaseGroup* const invariantOuterEdgeGroup					= new TestCaseGroup(m_context, "outer_edge_division",				"Test invariance rule #2");
		TestCaseGroup* const symmetricOuterEdgeGroup					= new TestCaseGroup(m_context, "outer_edge_symmetry",				"Test invariance rule #3");
		TestCaseGroup* const outerEdgeVertexSetIndexIndependenceGroup	= new TestCaseGroup(m_context, "outer_edge_index_independence",		"Test invariance rule #4");
		TestCaseGroup* const invariantTriangleSetGroup					= new TestCaseGroup(m_context, "triangle_set",						"Test invariance rule #5");
		TestCaseGroup* const invariantInnerTriangleSetGroup				= new TestCaseGroup(m_context, "inner_triangle_set",				"Test invariance rule #6");
		TestCaseGroup* const invariantOuterTriangleSetGroup				= new TestCaseGroup(m_context, "outer_triangle_set",				"Test invariance rule #7");
		TestCaseGroup* const tessCoordComponentRangeGroup				= new TestCaseGroup(m_context, "tess_coord_component_range",		"Test invariance rule #8, first part");
		TestCaseGroup* const oneMinusTessCoordComponentGroup			= new TestCaseGroup(m_context, "one_minus_tess_coord_component",	"Test invariance rule #8, second part");

		addChild(invarianceGroup);
		invarianceGroup->addChild(invariantPrimitiveSetGroup);
		invarianceGroup->addChild(invariantOuterEdgeGroup);
		invarianceGroup->addChild(symmetricOuterEdgeGroup);
		invarianceGroup->addChild(outerEdgeVertexSetIndexIndependenceGroup);
		invarianceGroup->addChild(invariantTriangleSetGroup);
		invarianceGroup->addChild(invariantInnerTriangleSetGroup);
		invarianceGroup->addChild(invariantOuterTriangleSetGroup);
		invarianceGroup->addChild(tessCoordComponentRangeGroup);
		invarianceGroup->addChild(oneMinusTessCoordComponentGroup);

		for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
		{
			const TessPrimitiveType		primitiveType	= (TessPrimitiveType)primitiveTypeI;
			const string				primName		= getTessPrimitiveTypeShaderName(primitiveType);
			const bool					triOrQuad		= primitiveType == TESSPRIMITIVETYPE_TRIANGLES || primitiveType == TESSPRIMITIVETYPE_QUADS;

			for (int spacingI = 0; spacingI < SPACINGMODE_LAST; spacingI++)
			{
				const SpacingMode	spacing			= (SpacingMode)spacingI;
				const string		primSpacName	= primName + "_" + getSpacingModeShaderName(spacing);

				if (triOrQuad)
				{
					invariantOuterEdgeGroup->addChild		(new InvariantOuterEdgeCase			(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantTriangleSetGroup->addChild		(new InvariantTriangleSetCase		(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantInnerTriangleSetGroup->addChild(new InvariantInnerTriangleSetCase	(m_context, primSpacName.c_str(), "", primitiveType, spacing));
					invariantOuterTriangleSetGroup->addChild(new InvariantOuterTriangleSetCase	(m_context, primSpacName.c_str(), "", primitiveType, spacing));
				}

				for (int windingI = 0; windingI < WINDING_LAST; windingI++)
				{
					const Winding	winding				= (Winding)windingI;
					const string	primSpacWindName	= primSpacName + "_" + getWindingShaderName(winding);

					for (int usePointModeI = 0; usePointModeI <= 1; usePointModeI++)
					{
						const bool		usePointMode			= usePointModeI != 0;
						const string	primSpacWindPointName	= primSpacWindName + (usePointMode ? "_point_mode" : "");

						invariantPrimitiveSetGroup->addChild		(new InvariantPrimitiveSetCase			(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						symmetricOuterEdgeGroup->addChild			(new SymmetricOuterEdgeCase				(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						tessCoordComponentRangeGroup->addChild		(new TessCoordComponentRangeCase		(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));
						oneMinusTessCoordComponentGroup->addChild	(new OneMinusTessCoordComponentCase		(m_context, primSpacWindPointName.c_str(), "", primitiveType, spacing, winding, usePointMode));

						if (triOrQuad)
							outerEdgeVertexSetIndexIndependenceGroup->addChild(new OuterEdgeVertexSetIndexIndependenceCase(m_context, primSpacWindPointName.c_str(), "",
																														   primitiveType, spacing, winding, usePointMode));
					}
				}
			}
		}
	}

	{
		static const struct
		{
			const char*					name;
			const char*					description;
			UserDefinedIOCase::IOType	ioType;
		} ioCases[] =
		{
			{ "per_patch",					"Per-patch TCS outputs",					UserDefinedIOCase::IO_TYPE_PER_PATCH				},
			{ "per_patch_array",			"Per-patch array TCS outputs",				UserDefinedIOCase::IO_TYPE_PER_PATCH_ARRAY			},
			{ "per_patch_block",			"Per-patch TCS outputs in IO block",		UserDefinedIOCase::IO_TYPE_PER_PATCH_BLOCK			},
			{ "per_patch_block_array",		"Per-patch TCS outputs in IO block array",	UserDefinedIOCase::IO_TYPE_PER_PATCH_BLOCK_ARRAY	},
			{ "per_vertex",					"Per-vertex TCS outputs",					UserDefinedIOCase::IO_TYPE_PER_VERTEX				},
			{ "per_vertex_block",			"Per-vertex TCS outputs in IO block",		UserDefinedIOCase::IO_TYPE_PER_VERTEX_BLOCK			},
		};

		TestCaseGroup* const userDefinedIOGroup = new TestCaseGroup(m_context, "user_defined_io", "Test non-built-in per-patch and per-vertex inputs and outputs");
		addChild(userDefinedIOGroup);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(ioCases); ++ndx)
		{
			TestCaseGroup* const ioTypeGroup = new TestCaseGroup(m_context, ioCases[ndx].name, ioCases[ndx].description);
			userDefinedIOGroup->addChild(ioTypeGroup);

			for (int vertexArraySizeI = 0; vertexArraySizeI < UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_LAST; vertexArraySizeI++)
			{
				const UserDefinedIOCase::VertexIOArraySize	vertexArraySize			= (UserDefinedIOCase::VertexIOArraySize)vertexArraySizeI;
				TestCaseGroup* const						vertexArraySizeGroup	= new TestCaseGroup(m_context,
																										vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_IMPLICIT
																											? "vertex_io_array_size_implicit"
																									  : vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN
																											? "vertex_io_array_size_shader_builtin"
																									  : vertexArraySizeI == UserDefinedIOCase::VERTEX_IO_ARRAY_SIZE_EXPLICIT_QUERY
																											? "vertex_io_array_size_query"
																									  : DE_NULL,
																									    "");
				ioTypeGroup->addChild(vertexArraySizeGroup);

				for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
				{
					const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
					vertexArraySizeGroup->addChild(new UserDefinedIOCase(m_context, getTessPrimitiveTypeShaderName(primitiveType), "", primitiveType, ioCases[ndx].ioType, vertexArraySize, UserDefinedIOCase::TESS_CONTROL_OUT_ARRAY_SIZE_IMPLICIT,
																		 (string() + "data/tessellation/user_defined_io_" + getTessPrimitiveTypeShaderName(primitiveType) + "_ref.png").c_str()));
				}

				if (ioCases[ndx].ioType == UserDefinedIOCase::IO_TYPE_PER_VERTEX
					|| ioCases[ndx].ioType == UserDefinedIOCase::IO_TYPE_PER_VERTEX_BLOCK)
				{
					for (int primitiveTypeI = 0; primitiveTypeI < TESSPRIMITIVETYPE_LAST; primitiveTypeI++)
					{
						const TessPrimitiveType primitiveType = (TessPrimitiveType)primitiveTypeI;
						vertexArraySizeGroup->addChild(new UserDefinedIOCase(m_context, (string(getTessPrimitiveTypeShaderName(primitiveType)) + "_explicit_tcs_out_size").c_str(), "", primitiveType, ioCases[ndx].ioType, vertexArraySize, UserDefinedIOCase::TESS_CONTROL_OUT_ARRAY_SIZE_LAYOUT,
																			 (string() + "data/tessellation/user_defined_io_" + getTessPrimitiveTypeShaderName(primitiveType) + "_ref.png").c_str()));
					}
				}
			}
		}

		{
			de::MovePtr<TestCaseGroup>	negativeGroup	(new TestCaseGroup(m_context, "negative", "Negative cases"));

			{
				de::MovePtr<TestCaseGroup>			es31Group		(new TestCaseGroup(m_context, "es31", "GLSL ES 3.1 Negative cases"));
				gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
				const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es31/tessellation_negative_user_defined_io.test");

				for (int i = 0; i < (int)children.size(); i++)
					es31Group->addChild(children[i]);

				negativeGroup->addChild(es31Group.release());
			}

			{
				de::MovePtr<TestCaseGroup>			es32Group		(new TestCaseGroup(m_context, "es32", "GLSL ES 3.2 Negative cases"));
				gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
				const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es32/tessellation_negative_user_defined_io.test");

				for (int i = 0; i < (int)children.size(); i++)
					es32Group->addChild(children[i]);

				negativeGroup->addChild(es32Group.release());
			}

			userDefinedIOGroup->addChild(negativeGroup.release());
		}
	}
}